

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMixedMeshControl::DeletePressureElements(TPZMHMixedMeshControl *this)

{
  TPZCompEl *pTVar1;
  long iel;
  long lVar2;
  
  TPZGeoMesh::ResetReference(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
  lVar2 = (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  iel = 0;
  if (lVar2 < 1) {
    lVar2 = iel;
  }
  for (; lVar2 != iel; iel = iel + 1) {
    pTVar1 = TPZCompMesh::Element
                       (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer,iel);
    if (pTVar1 != (TPZCompEl *)0x0) {
      (**(code **)(*(long *)pTVar1 + 8))(pTVar1);
    }
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::DeletePressureElements()
{
    fGMesh->ResetReference();
    int64_t nel = fPressureFineMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        if (cel) {
            delete cel;
        }
    }
}